

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DumbDirectoryDatabase::write_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  uint uVar2;
  LogLevel LVar3;
  char *__filename;
  FILE *pFVar4;
  undefined8 uVar5;
  size_t sVar6;
  FILE *file;
  string local_98;
  undefined1 local_78 [8];
  string path;
  char filename [25];
  PayloadWriteFlags flags_local;
  size_t size_local;
  void *blob_local;
  Hash hash_local;
  ResourceTag tag_local;
  DumbDirectoryDatabase *this_local;
  
  if ((flags & 1) == 0) {
    if (this->mode == ReadOnly) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this,(ulong)tag,hash);
      if ((uVar2 & 1) == 0) {
        sprintf(path.field_2._M_local_buf + 8,"%02x.%016lx.json",(ulong)tag,hash);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_98,path.field_2._M_local_buf + 8,(allocator *)((long)&file + 7))
        ;
        Path::join((string *)local_78,&this->base_directory,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
        __filename = (char *)std::__cxx11::string::c_str();
        pFVar4 = fopen(__filename,"wb");
        if (pFVar4 == (FILE *)0x0) {
          LVar3 = get_thread_log_level();
          if ((int)LVar3 < 3) {
            uVar5 = std::__cxx11::string::c_str();
            bVar1 = Internal::log_thread_callback
                              (LOG_ERROR,"Failed to write serialized state to disk (%s).\n",uVar5);
            pFVar4 = _stderr;
            if (!bVar1) {
              uVar5 = std::__cxx11::string::c_str();
              fprintf(pFVar4,"Fossilize ERROR: Failed to write serialized state to disk (%s).\n",
                      uVar5);
            }
          }
          this_local._7_1_ = false;
        }
        else {
          sVar6 = fwrite(blob,1,size,pFVar4);
          if (sVar6 == size) {
            fclose(pFVar4);
            this_local._7_1_ = true;
          }
          else {
            LVar3 = get_thread_log_level();
            if (((int)LVar3 < 3) &&
               (bVar1 = Internal::log_thread_callback
                                  (LOG_ERROR,"Failed to write serialized state to disk.\n"), !bVar1)
               ) {
              fprintf(_stderr,"Fossilize ERROR: Failed to write serialized state to disk.\n");
            }
            fclose(pFVar4);
            this_local._7_1_ = false;
          }
        }
        std::__cxx11::string::~string((string *)local_78);
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode == DatabaseMode::ReadOnly)
			return false;

		if (has_entry(tag, hash))
			return true;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "wb");
		if (!file)
		{
			LOGE_LEVEL("Failed to write serialized state to disk (%s).\n", path.c_str());
			return false;
		}

		if (fwrite(blob, 1, size, file) != size)
		{
			LOGE_LEVEL("Failed to write serialized state to disk.\n");
			fclose(file);
			return false;
		}

		fclose(file);
		return true;
	}